

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_geom_buf.cxx
# Opt level: O2

void __thiscall write_sw::operator()(write_sw *this,ogf4_slide_window *sw,xr_writer *w)

{
  uint16_t local_20;
  uint16_t local_1e;
  uint32_t local_1c;
  
  local_1c = sw->offset;
  (*w->_vptr_xr_writer[2])(w,&local_1c,4);
  local_20 = sw->num_tris;
  (*w->_vptr_xr_writer[2])(w,&local_20,2);
  local_1e = sw->num_verts;
  (*w->_vptr_xr_writer[2])(w,&local_1e,2);
  return;
}

Assistant:

void operator()(const ogf4_slide_window& sw, xr_writer& w) const {
	w.w_u32(sw.offset);
	w.w_u16(sw.num_tris);
	w.w_u16(sw.num_verts);
}